

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     DefaultPrintTo<std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>>
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *param_1,
               ostream *param_2)

{
  bool bVar1;
  reference value;
  __normal_iterator<const_std::array<int,_10UL>_*,_std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>
  local_40;
  __normal_iterator<const_std::array<int,_10UL>_*,_std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>
  local_38;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *container_local;
  
  std::operator<<(param_2,'{');
  it._M_current = (array<int,_10UL> *)0x0;
  local_38._M_current =
       (array<int,_10UL> *)
       std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::begin(param_1);
  do {
    local_40._M_current =
         (array<int,_10UL> *)
         std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::end(param_1);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) {
LAB_00120568:
      if (it._M_current != (array<int,_10UL> *)0x0) {
        std::operator<<(param_2,' ');
      }
      std::operator<<(param_2,'}');
      return;
    }
    if ((it._M_current != (array<int,_10UL> *)0x0) &&
       (std::operator<<(param_2,','), it._M_current == (array<int,_10UL> *)0x20)) {
      std::operator<<(param_2," ...");
      goto LAB_00120568;
    }
    std::operator<<(param_2,' ');
    value = __gnu_cxx::
            __normal_iterator<const_std::array<int,_10UL>_*,_std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>
            ::operator*(&local_38);
    UniversalPrint<std::array<int,10ul>>(value,param_2);
    __gnu_cxx::
    __normal_iterator<const_std::array<int,_10UL>_*,_std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>
    ::operator++(&local_38);
    it._M_current = (array<int,_10UL> *)((long)(it._M_current)->_M_elems + 1);
  } while( true );
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}